

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap_reader.cpp
# Opt level: O3

bool __thiscall pcap_reader::Open(pcap_reader *this,char *f_name,char *f_extract_name)

{
  pcap_hdr_t *__ptr;
  uint32_t uVar1;
  uint in_EAX;
  FILE *__stream;
  FILE *pFVar2;
  size_t sVar3;
  int err;
  undefined8 uStack_28;
  
  if ((this->F_pcap == (FILE *)0x0) && (this->F_extract == (FILE *)0x0)) {
    uStack_28 = (ulong)in_EAX;
    if ((*f_name == '-') && (f_name[1] == '\0')) {
      __stream = (FILE *)ithi_reopen_stdin((int *)((long)&uStack_28 + 4));
    }
    else {
      __stream = (FILE *)ithi_file_open_ex(f_name,"rb",(int *)((long)&uStack_28 + 4));
    }
    this->F_pcap = (FILE *)__stream;
    if (__stream == (FILE *)0x0 || uStack_28._4_4_ != 0) {
LAB_0016c170:
      printf("Error: %d (0x%x) for %s\n",(ulong)uStack_28._4_4_,(ulong)uStack_28._4_4_,f_name);
      return false;
    }
    if (f_extract_name != (char *)0x0) {
      pFVar2 = ithi_file_open_ex(f_extract_name,"wb",(int *)((long)&uStack_28 + 4));
      this->F_extract = pFVar2;
      __stream = (FILE *)this->F_pcap;
      f_name = f_extract_name;
      if (__stream == (FILE *)0x0 || uStack_28._4_4_ != 0) goto LAB_0016c170;
    }
    __ptr = &this->header;
    sVar3 = fread(__ptr,0x18,1,__stream);
    if (sVar3 == 1) {
      uVar1 = __ptr->magic_number;
      if ((int)uVar1 < -0x2b3c4d5f) {
        if ((uVar1 != 0xa1b23c4d) && (uVar1 != 0xa1b2c3d4)) {
          return false;
        }
      }
      else {
        if ((uVar1 != 0x4dc3b2a1) && (uVar1 != 0xd4c3b2a1)) {
          return false;
        }
        this->is_wrong_endian = true;
      }
      if ((FILE *)this->F_extract != (FILE *)0x0) {
        sVar3 = fwrite(__ptr,0x18,1,(FILE *)this->F_extract);
        return sVar3 == 1;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool pcap_reader::Open(char const * f_name, char * f_extract_name)
{
    bool ret = true;

    if (F_pcap != NULL || F_extract != NULL)
    {
        ret = false;
    }
    else
    {
        int err = 0;

        if (strcmp(f_name, "-") == 0) {
            F_pcap = ithi_reopen_stdin(&err);
        }
        else {
            F_pcap = ithi_file_open_ex(f_name, "rb", &err);
        }

        if (err != 0 || F_pcap == NULL)
        {
            ret = false;
            printf("Error: %d (0x%x) for %s\n", err, err, f_name);
        } else if (f_extract_name != NULL) {
            F_extract = ithi_file_open_ex(f_extract_name, "wb", &err);
            if (err != 0 || F_pcap == NULL)
            {
                ret = false;
                printf("Error: %d (0x%x) for %s\n", err, err, f_extract_name);
            }
        }

        if (ret)
        {
            size_t nb_read = fread(&header, sizeof(header), 1, F_pcap);

            ret = (nb_read == 1);

            if (ret)
            {
                switch (header.magic_number)
                {
                case 0xa1b2c3d4: /* microseconds */
                    break;
                case 0xd4c3b2a1: /* microseconds, swapped */
                    is_wrong_endian = true;
                    break;
                case 0xa1b23c4d: /* nanoseconds */
                    break;
                case 0x4dc3b2a1: /* nanoseconds, swapped */
                    is_wrong_endian = true;
                    break;
                default:
                    ret = false;
                    break;
                }
            }

            if (ret && is_wrong_endian)
            {
                /* TODO: swap the values.. */
            }

            if (ret && F_extract != NULL)
            {
                ret = (fwrite(&header, sizeof(header), 1, F_extract) == 1);
            }
        }
    }

    return ret;
}